

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

void __thiscall LineSpecialTable::LineSpecialTable(LineSpecialTable *this)

{
  int iVar1;
  FLineSpecial **ppFVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  
  (this->LineSpecialsInfo).Array = (FLineSpecial **)0x0;
  (this->LineSpecialsInfo).Most = 0;
  (this->LineSpecialsInfo).Count = 0;
  iVar5 = 0;
  for (lVar3 = 8; lVar3 != 0xf78; lVar3 = lVar3 + 0x10) {
    iVar1 = *(int *)((long)&LineSpecialNames[0].name + lVar3);
    if (iVar5 < iVar1) {
      iVar5 = iVar1;
    }
  }
  TArray<FLineSpecial_*,_FLineSpecial_*>::Resize(&this->LineSpecialsInfo,iVar5 + 1U);
  for (uVar4 = 0; iVar5 + 1U != uVar4; uVar4 = uVar4 + 1) {
    (this->LineSpecialsInfo).Array[uVar4] = (FLineSpecial *)0x0;
  }
  qsort(LineSpecialNames,0xf7,0x10,lscmp);
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0xf70) {
      return;
    }
    iVar5 = *(int *)((long)&LineSpecialNames[0].number + lVar3);
    ppFVar2 = (this->LineSpecialsInfo).Array;
    if (ppFVar2[iVar5] != (FLineSpecial *)0x0) break;
    ppFVar2[iVar5] = (FLineSpecial *)((long)&LineSpecialNames[0].name + lVar3);
    lVar3 = lVar3 + 0x10;
  }
  __assert_fail("LineSpecialsInfo[LineSpecialNames[i].number] == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_lnspec.cpp"
                ,0xe20,"LineSpecialTable::LineSpecialTable()");
}

Assistant:

LineSpecialTable()
	{
		unsigned int max = 0;
		for (size_t i = 0; i < countof(LineSpecialNames); ++i)
		{
			if (LineSpecialNames[i].number > (int)max)
				max = LineSpecialNames[i].number;
		}
		LineSpecialsInfo.Resize(max + 1);
		for (unsigned i = 0; i <= max; i++)
		{
			LineSpecialsInfo[i] = NULL;
		}

		qsort(LineSpecialNames, countof(LineSpecialNames), sizeof(FLineSpecial), lscmp);
		for (size_t i = 0; i < countof(LineSpecialNames); ++i)
		{
			assert(LineSpecialsInfo[LineSpecialNames[i].number] == NULL);
			LineSpecialsInfo[LineSpecialNames[i].number] = &LineSpecialNames[i];
		}
	}